

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O3

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::run
          (raw_stream_logic *this,string *host,string *port,string *path)

{
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  *this_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  bind_front_wrapper<void_(m2d::savanna::async_websocket::interface::*)(boost::system::error_code,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
  local_48;
  
  std::__cxx11::string::_M_assign((string *)&this->host_);
  std::__cxx11::string::_M_assign((string *)&this->port_);
  std::__cxx11::string::_M_assign((string *)&this->path_);
  this_00 = (basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
             *)(this->resolver_).
               super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  std::__shared_ptr<m2d::savanna::async_websocket::interface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<m2d::savanna::async_websocket::interface,void>
            ((__shared_ptr<m2d::savanna::async_websocket::interface,(__gnu_cxx::_Lock_policy)2> *)
             &local_58,
             (__weak_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_interface).
              super_enable_shared_from_this<m2d::savanna::async_websocket::interface>);
  local_48.h_ = (offset_in_interface_to_subr)async_websocket::interface::on_resolve;
  local_48._8_8_ = 0;
  local_48.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>.t.
  super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58;
  local_48.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>.t.
  super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_50;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<boost::beast::detail::bind_front_wrapper<void(m2d::savanna::async_websocket::interface::*)(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),std::shared_ptr<m2d::savanna::async_websocket::interface>>>
            (this_00,&this->host_,&this->port_,0,&local_48);
  if (local_48.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>.t.
      super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
               .
               super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::async_websocket::interface>_>
               .t.
               super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return;
}

Assistant:

void run(std::string host, std::string port, std::string path) override
			{
				host_ = host;
				port_ = port;
				path_ = path;
				resolver_->async_resolve(host_, port_, beast::bind_front_handler(&interface::on_resolve, this->shared_from_this()));
			}